

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O1

void __thiscall
vkt::texture::anon_unknown_0::Texture2DLodControlTestInstance::Texture2DLodControlTestInstance
          (Texture2DLodControlTestInstance *this,Context *context,
          Texture2DMipmapTestCaseParameters *testParameters)

{
  deInt32 *pdVar1;
  char *pcVar2;
  Precision PVar3;
  FilterMode FVar4;
  FilterMode FVar5;
  FilterMode FVar6;
  WrapMode WVar7;
  WrapMode WVar8;
  VkFormat VVar9;
  undefined4 uVar10;
  SharedPtrStateBase *pSVar11;
  TestTexture2D *pTVar12;
  SharedPtrStateBase *pSVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  Vec4 local_68;
  PixelBufferAccess local_58;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__Texture2DLodControlTestInstance_00d31eb8;
  this->m_texWidth = 0x40;
  this->m_texHeight = 0x40;
  PVar3 = (testParameters->super_Texture2DTestCaseParameters).super_TextureCommonTestCaseParameters.
          texCoordPrecision;
  FVar4 = (testParameters->super_Texture2DTestCaseParameters).super_TextureCommonTestCaseParameters.
          minFilter;
  FVar5 = (testParameters->super_Texture2DTestCaseParameters).super_TextureCommonTestCaseParameters.
          magFilter;
  FVar6 = (testParameters->super_Texture2DTestCaseParameters).super_TextureCommonTestCaseParameters.
          magFilter;
  WVar7 = (testParameters->super_Texture2DTestCaseParameters).super_TextureCommonTestCaseParameters.
          wrapS;
  WVar8 = (testParameters->super_Texture2DTestCaseParameters).super_TextureCommonTestCaseParameters.
          wrapT;
  VVar9 = (testParameters->super_Texture2DTestCaseParameters).super_TextureCommonTestCaseParameters.
          format;
  (this->m_testParameters).super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
  sampleCount = (testParameters->super_Texture2DTestCaseParameters).
                super_TextureCommonTestCaseParameters.sampleCount;
  (this->m_testParameters).super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
  texCoordPrecision = PVar3;
  (this->m_testParameters).super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
  minFilter = FVar4;
  (this->m_testParameters).super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
  magFilter = FVar5;
  (this->m_testParameters).super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
  magFilter = FVar6;
  (this->m_testParameters).super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
  wrapS = WVar7;
  (this->m_testParameters).super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
  wrapT = WVar8;
  (this->m_testParameters).super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
  format = VVar9;
  std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::vector
            (&(this->m_testParameters).super_Texture2DTestCaseParameters.
              super_TextureCommonTestCaseParameters.programs,
             &(testParameters->super_Texture2DTestCaseParameters).
              super_TextureCommonTestCaseParameters.programs);
  iVar17 = (testParameters->super_Texture2DTestCaseParameters).height;
  (this->m_testParameters).super_Texture2DTestCaseParameters.width =
       (testParameters->super_Texture2DTestCaseParameters).width;
  (this->m_testParameters).super_Texture2DTestCaseParameters.height = iVar17;
  uVar10 = *(undefined4 *)&(testParameters->super_TextureMipmapCommonTestCaseParameters).field_0x4;
  pcVar2 = (testParameters->super_TextureMipmapCommonTestCaseParameters).minFilterName;
  (this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.coordType =
       (testParameters->super_TextureMipmapCommonTestCaseParameters).coordType;
  *(undefined4 *)&(this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.field_0x4 =
       uVar10;
  (this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.minFilterName = pcVar2;
  this->m_minFilter =
       (testParameters->super_Texture2DTestCaseParameters).super_TextureCommonTestCaseParameters.
       minFilter;
  (this->m_texture).m_ptr = (TestTexture2D *)0x0;
  (this->m_texture).m_state = (SharedPtrStateBase *)0x0;
  pSVar11 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar11->strongRefCount = 0;
  pSVar11->weakRefCount = 0;
  pSVar11->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d31ad0;
  pSVar11[1]._vptr_SharedPtrStateBase = (_func_int **)0x0;
  (this->m_texture).m_state = pSVar11;
  pSVar11->strongRefCount = 1;
  pSVar11->weakRefCount = 1;
  util::TextureRenderer::TextureRenderer
            (&this->m_renderer,context,
             (testParameters->super_Texture2DTestCaseParameters).
             super_TextureCommonTestCaseParameters.sampleCount,this->m_texWidth << 2,
             this->m_texHeight << 2);
  uVar14 = this->m_texHeight;
  if (this->m_texHeight < this->m_texWidth) {
    uVar14 = this->m_texWidth;
  }
  if (uVar14 == 0) {
    uVar16 = 0x20;
  }
  else {
    uVar16 = 0x1f;
    if (uVar14 != 0) {
      for (; uVar14 >> uVar16 == 0; uVar16 = uVar16 - 1) {
      }
    }
    uVar16 = uVar16 ^ 0x1f;
  }
  pTVar12 = (TestTexture2D *)operator_new(0x70);
  local_58.super_ConstPixelBufferAccess.m_format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  vkt::pipeline::TestTexture2D::TestTexture2D
            (pTVar12,(TextureFormat *)&local_58,this->m_texWidth,this->m_texHeight);
  pSVar13 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar13->strongRefCount = 0;
  pSVar13->weakRefCount = 0;
  pSVar13->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d31ad0;
  pSVar13[1]._vptr_SharedPtrStateBase = (_func_int **)pTVar12;
  pSVar13->strongRefCount = 1;
  pSVar13->weakRefCount = 1;
  pSVar11 = (this->m_texture).m_state;
  if (pSVar11 != pSVar13) {
    if (pSVar11 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar11->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_texture).m_ptr = (TestTexture2D *)0x0;
        (*((this->m_texture).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_texture).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar11 = (this->m_texture).m_state;
        if (pSVar11 != (SharedPtrStateBase *)0x0) {
          (*pSVar11->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_texture).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_texture).m_ptr = pTVar12;
    (this->m_texture).m_state = pSVar13;
    LOCK();
    pSVar13->strongRefCount = pSVar13->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_texture).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  LOCK();
  pdVar1 = &pSVar13->strongRefCount;
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar13->_vptr_SharedPtrStateBase[2])(pSVar13);
  }
  LOCK();
  pdVar1 = &pSVar13->weakRefCount;
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar13->_vptr_SharedPtrStateBase[1])(pSVar13);
  }
  if (uVar14 != 0) {
    uVar15 = 0;
    iVar17 = 0;
    if (0 < (int)(0x1f - uVar16)) {
      iVar17 = 0x1f - uVar16;
    }
    do {
      pTVar12 = (this->m_texture).m_ptr;
      (*(pTVar12->super_TestTexture)._vptr_TestTexture[7])(&local_58,pTVar12,uVar15,0);
      tcu::RGBA::toVec((RGBA *)&local_68);
      tcu::clear(&local_58,&local_68);
      uVar14 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar14;
    } while (iVar17 + 1U != uVar14);
  }
  util::TextureRenderer::add2DTexture(&this->m_renderer,&this->m_texture);
  return;
}

Assistant:

Texture2DLodControlTestInstance::Texture2DLodControlTestInstance (Context& context, const Texture2DMipmapTestCaseParameters& testParameters)
	: TestInstance		(context)
	, m_texWidth		(64) //64
	, m_texHeight		(64)//64
	, m_testParameters	(testParameters)
	, m_minFilter		(testParameters.minFilter)
	, m_texture			(DE_NULL)
	, m_renderer		(context, testParameters.sampleCount, m_texWidth*4, m_texHeight*4)
{
	const VkFormat	format		= VK_FORMAT_R8G8B8A8_UNORM;
	const int		numLevels	= deLog2Floor32(de::max(m_texWidth, m_texHeight))+1;

	m_texture = TestTexture2DSp(new pipeline::TestTexture2D(vk::mapVkFormat(format), m_texWidth, m_texHeight));

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		const deUint32	step	= 0xff / (numLevels-1);
		const deUint32	inc		= deClamp32(step*levelNdx, 0x00, 0xff);
		const deUint32	dec		= 0xff - inc;
		const deUint32	rgb		= (inc << 16) | (dec << 8) | 0xff;
		const deUint32	color	= 0xff000000 | rgb;

		tcu::clear(m_texture->getLevel(levelNdx, 0), tcu::RGBA(color).toVec());
	}

	m_renderer.add2DTexture(m_texture);
}